

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::BlenderModifierShowcase::ApplyModifiers
          (BlenderModifierShowcase *this,aiNode *out,ConversionData *conv_data,Scene *in,
          Object *orig_object)

{
  long lVar1;
  char *__s;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  Structure *pSVar5;
  Logger *pLVar6;
  basic_formatter *pbVar7;
  Field *pFVar8;
  vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
  *pvVar9;
  reference ppBVar10;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar11;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_448;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_2b0;
  BlenderModifier *local_290;
  BlenderModifier *modifier;
  BlenderModifier **local_280;
  value_type local_278;
  __normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
  local_270;
  iterator endmod;
  iterator curmod;
  fpCreateModifier *curgod;
  ModifierData *dat;
  string local_248;
  Field *local_228;
  Field *f;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  Structure *local_50;
  Structure *s;
  SharedModifierData *cur;
  size_t ful;
  size_t cnt;
  Object *orig_object_local;
  Scene *in_local;
  ConversionData *conv_data_local;
  aiNode *out_local;
  BlenderModifierShowcase *this_local;
  
  ful = 0;
  cur = (SharedModifierData *)0x0;
  cnt = (size_t)orig_object;
  orig_object_local = (Object *)in;
  in_local = (Scene *)conv_data;
  conv_data_local = (ConversionData *)out;
  out_local = (aiNode *)this;
  s = (Structure *)
      ::std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                (&(orig_object->modifiers).first.
                  super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>);
  do {
    if (s == (Structure *)0x0) {
      if (cur != (SharedModifierData *)0x0) {
        pLVar6 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[35]>(&local_5c0,(char (*) [35])"BlendModifier: found handlers for ");
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_5c0,&ful);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [5])0xc82220);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(unsigned_long *)&cur);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [16])" modifiers on `");
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [1024])(cnt + 0x20));
        pbVar7 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar11,(char (*) [39])"`, check log messages above for errors");
        Formatter::basic_formatter::operator_cast_to_string(&local_448,pbVar7);
        Logger::debug(pLVar6,&local_448);
        ::std::__cxx11::string::~string((string *)&local_448);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_5c0);
      }
      return;
    }
    if ((s->name)._M_string_length == 0) {
      __assert_fail("cur->dna_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderModifier.cpp"
                    ,0x5a,
                    "void Assimp::Blender::BlenderModifierShowcase::ApplyModifiers(aiNode &, ConversionData &, const Scene &, const Object &)"
                   );
    }
    lVar1 = *(long *)((in_local->id).name + 0x128);
    __s = (char *)(s->name)._M_string_length;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    pSVar5 = DNA::Get((DNA *)(lVar1 + 8),&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::allocator<char>::~allocator(&local_71);
    local_50 = pSVar5;
    if (pSVar5 == (Structure *)0x0) {
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[44]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 (char (*) [44])"BlendModifier: could not resolve DNA name: ");
      pbVar7 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&f,
                         (char **)&(s->name)._M_string_length);
      Formatter::basic_formatter::operator_cast_to_string(&local_a8,pbVar7);
      Logger::warn(pLVar6,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"modifier",(allocator<char> *)((long)&dat + 7));
      pFVar8 = Structure::Get(pSVar5,&local_248);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&dat + 7));
      local_228 = pFVar8;
      if ((pFVar8 == (Field *)0x0) || (pFVar8->offset != 0)) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"BlendModifier: expected a `modifier` member at offset 0");
      }
      else {
        local_50 = DNA::Get((DNA *)(*(long *)((in_local->id).name + 0x128) + 8),&pFVar8->type);
        if ((local_50 == (Structure *)0x0) ||
           (bVar3 = ::std::operator!=(&local_50->name,"ModifierData"), pSVar5 = s, bVar3)) {
          pLVar6 = DefaultLogger::get();
          Logger::warn(pLVar6,"BlendModifier: expected a ModifierData structure as first member");
        }
        else {
          psVar2 = &s->name;
          curmod._M_current = (BlenderModifier **)creators;
          pvVar9 = (vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                    *)TempArray<std::vector,_Assimp::Blender::BlenderModifier>::operator->
                                (&this->cached_modifiers);
          endmod._M_current =
               (BlenderModifier **)
               ::std::
               vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
               ::begin(pvVar9);
          pvVar9 = (vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                    *)TempArray<std::vector,_Assimp::Blender::BlenderModifier>::operator->
                                (&this->cached_modifiers);
          local_270._M_current =
               (BlenderModifier **)
               ::std::
               vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
               ::end(pvVar9);
          while (*curmod._M_current != (BlenderModifier *)0x0) {
            bVar3 = __gnu_cxx::operator==(&endmod,&local_270);
            if (bVar3) {
              pvVar9 = (vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                        *)TempArray<std::vector,_Assimp::Blender::BlenderModifier>::operator->
                                    (&this->cached_modifiers);
              local_278 = (value_type)(*(code *)*curmod._M_current)();
              std::
              vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
              ::push_back(pvVar9,&local_278);
              pvVar9 = (vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                        *)TempArray<std::vector,_Assimp::Blender::BlenderModifier>::operator->
                                    (&this->cached_modifiers);
              local_280 = (BlenderModifier **)
                          ::std::
                          vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                          ::end(pvVar9);
              local_270._M_current = local_280;
              modifier = (BlenderModifier *)
                         __gnu_cxx::
                         __normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
                         ::operator-(&local_270,1);
              endmod._M_current = (BlenderModifier **)modifier;
            }
            ppBVar10 = __gnu_cxx::
                       __normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
                       ::operator*(&endmod);
            local_290 = *ppBVar10;
            uVar4 = (*local_290->_vptr_BlenderModifier[2])(local_290,&psVar2->field_2);
            if ((uVar4 & 1) != 0) {
              (*local_290->_vptr_BlenderModifier[3])
                        (local_290,conv_data_local,in_local,s,orig_object_local,cnt);
              ful = ful + 1;
              curmod._M_current = (BlenderModifier **)0x0;
              break;
            }
            curmod._M_current = curmod._M_current + 1;
            __gnu_cxx::
            __normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
            ::operator++(&endmod);
          }
          if (curmod._M_current != (BlenderModifier **)0x0) {
            pLVar6 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[39]>
                      (&local_428,(char (*) [39])"Couldn\'t find a handler for modifier: ");
            pbVar7 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_428,
                               (char (*) [32])
                               &(pSVar5->indices)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent);
            Formatter::basic_formatter::operator_cast_to_string(&local_2b0,pbVar7);
            Logger::warn(pLVar6,&local_2b0);
            ::std::__cxx11::string::~string((string *)&local_2b0);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_428);
          }
        }
      }
    }
    s = (Structure *)
        ::std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2> *)&s->fields
                  );
    cur = cur + 1;
  } while( true );
}

Assistant:

void BlenderModifierShowcase::ApplyModifiers(aiNode& out, ConversionData& conv_data, const Scene& in, const Object& orig_object )
{
    size_t cnt = 0u, ful = 0u;

    // NOTE: this cast is potentially unsafe by design, so we need to perform type checks before
    // we're allowed to dereference the pointers without risking to crash. We might still be
    // invoking UB btw - we're assuming that the ModifierData member of the respective modifier
    // structures is at offset sizeof(vftable) with no padding.
    const SharedModifierData* cur = static_cast<const SharedModifierData *> ( orig_object.modifiers.first.get() );
    for (; cur; cur =  static_cast<const SharedModifierData *> ( cur->modifier.next.get() ), ++ful) {
        ai_assert(cur->dna_type);

        const Structure* s = conv_data.db.dna.Get( cur->dna_type );
        if (!s) {
            ASSIMP_LOG_WARN_F("BlendModifier: could not resolve DNA name: ",cur->dna_type);
            continue;
        }

        // this is a common trait of all XXXMirrorData structures in BlenderDNA
        const Field* f = s->Get("modifier");
        if (!f || f->offset != 0) {
            ASSIMP_LOG_WARN("BlendModifier: expected a `modifier` member at offset 0");
            continue;
        }

        s = conv_data.db.dna.Get( f->type );
        if (!s || s->name != "ModifierData") {
            ASSIMP_LOG_WARN("BlendModifier: expected a ModifierData structure as first member");
            continue;
        }

        // now, we can be sure that we should be fine to dereference *cur* as
        // ModifierData (with the above note).
        const ModifierData& dat = cur->modifier;

        const fpCreateModifier* curgod = creators;
        std::vector< BlenderModifier* >::iterator curmod = cached_modifiers->begin(), endmod = cached_modifiers->end();

        for (;*curgod;++curgod,++curmod) { // allocate modifiers on the fly
            if (curmod == endmod) {
                cached_modifiers->push_back((*curgod)());

                endmod = cached_modifiers->end();
                curmod = endmod-1;
            }

            BlenderModifier* const modifier = *curmod;
            if(modifier->IsActive(dat)) {
                modifier->DoIt(out,conv_data,*static_cast<const ElemBase *>(cur),in,orig_object);
                cnt++;

                curgod = NULL;
                break;
            }
        }
        if (curgod) {
            ASSIMP_LOG_WARN_F("Couldn't find a handler for modifier: ",dat.name);
        }
    }

    // Even though we managed to resolve some or all of the modifiers on this
    // object, we still can't say whether our modifier implementations were
    // able to fully do their job.
    if (ful) {
        ASSIMP_LOG_DEBUG_F("BlendModifier: found handlers for ",cnt," of ",ful," modifiers on `",orig_object.id.name,
            "`, check log messages above for errors");
    }
}